

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall StatusPrinter::BuildFinished(StatusPrinter *this)

{
  allocator<char> local_31;
  string local_30;
  
  LinePrinter::SetConsoleLocked(&this->printer_,false);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  LinePrinter::PrintOnNewLine(&this->printer_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void StatusPrinter::BuildFinished() {
  printer_.SetConsoleLocked(false);
  printer_.PrintOnNewLine("");
}